

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

void __thiscall
olc::PixelGameEngine::DrawPartialRotatedDecal
          (PixelGameEngine *this,vf2d *pos,Decal *decal,float fAngle,vf2d *center,vf2d *source_pos,
          vf2d *source_size,vf2d *scale,Pixel *tint)

{
  float fVar1;
  double dVar2;
  double dVar3;
  int i;
  long lVar4;
  float fVar5;
  float fVar6;
  DecalInstance di;
  anon_union_4_2_12391da5_for_Pixel_0 local_c8;
  anon_union_4_2_12391da5_for_Pixel_0 aStack_c4;
  anon_union_4_2_12391da5_for_Pixel_0 aStack_c0;
  anon_union_4_2_12391da5_for_Pixel_0 aStack_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  undefined1 local_a8 [32];
  pointer local_88;
  pointer pvStack_80;
  pointer local_78;
  pointer pfStack_70;
  pointer local_68;
  pointer pfStack_60;
  pointer local_58;
  pointer pPStack_50;
  pointer local_48;
  DecalMode DStack_40;
  uint32_t uStack_3c;
  
  local_a8._8_8_ = (pointer)0x0;
  local_48 = (pointer)0x0;
  local_58 = (pointer)0x0;
  pPStack_50 = (pointer)0x0;
  local_68 = (pointer)0x0;
  pfStack_60 = (pointer)0x0;
  local_78 = (pointer)0x0;
  pfStack_70 = (pointer)0x0;
  local_88 = (pointer)0x0;
  pvStack_80 = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  local_a8._24_8_ = (pointer)0x0;
  DStack_40 = NORMAL;
  uStack_3c = 4;
  local_c8.field_1 =
       *(anon_struct_4_4_d83cdc77_for_anon_union_4_2_12391da5_for_Pixel_0_1 *)&tint->field_0;
  aStack_c4.field_1 = local_c8.field_1;
  aStack_c0.field_1 = local_c8.field_1;
  aStack_bc.field_1 = local_c8.field_1;
  local_a8._0_8_ = decal;
  std::vector<olc::Pixel,std::allocator<olc::Pixel>>::_M_assign_aux<olc::Pixel_const*>
            ((vector<olc::Pixel,std::allocator<olc::Pixel>> *)&local_58,&local_c8);
  local_c8.n = 0x3f800000;
  aStack_c4 = (anon_union_4_2_12391da5_for_Pixel_0)0x3f800000;
  aStack_c0 = (anon_union_4_2_12391da5_for_Pixel_0)0x3f800000;
  aStack_bc = (anon_union_4_2_12391da5_for_Pixel_0)0x3f800000;
  std::vector<float,std::allocator<float>>::_M_assign_aux<float_const*>
            ((vector<float,std::allocator<float>> *)&pfStack_70,&local_c8);
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
             (local_a8 + 8),4);
  fVar5 = center->y;
  fVar6 = scale->y;
  *(float *)local_a8._8_8_ = (0.0 - center->x) * scale->x;
  *(float *)(local_a8._8_8_ + 4) = (0.0 - fVar5) * fVar6;
  fVar5 = source_size->y;
  fVar6 = center->y;
  fVar1 = scale->y;
  ((pointer)(local_a8._8_8_ + 8))->x = (0.0 - center->x) * scale->x;
  ((pointer)(local_a8._8_8_ + 8))->y = (fVar5 - fVar6) * fVar1;
  fVar5 = source_size->y;
  fVar6 = center->y;
  fVar1 = scale->y;
  ((pointer)(local_a8._8_8_ + 0x10))->x = (source_size->x - center->x) * scale->x;
  ((pointer)(local_a8._8_8_ + 0x10))->y = (fVar5 - fVar6) * fVar1;
  fVar5 = center->y;
  fVar6 = scale->y;
  ((pointer)(local_a8._8_8_ + 0x18))->x = (source_size->x - center->x) * scale->x;
  ((pointer)(local_a8._8_8_ + 0x18))->y = (0.0 - fVar5) * fVar6;
  dVar2 = cos((double)fAngle);
  dVar3 = sin((double)fAngle);
  lVar4 = 0;
  do {
    fVar5 = ((pointer)(local_a8._8_8_ + lVar4 * 8))->x;
    fVar6 = pos->y;
    ((pointer)(local_a8._8_8_ + lVar4 * 8))->x =
         (fVar5 * (float)dVar2 - (float)dVar3 * ((pointer)(local_a8._8_8_ + lVar4 * 8))->y) + pos->x
    ;
    ((pointer)(local_a8._8_8_ + lVar4 * 8))->y =
         fVar5 * (float)dVar3 + ((pointer)(local_a8._8_8_ + lVar4 * 8))->y * (float)dVar2 + fVar6;
    fVar5 = ((pointer)(local_a8._8_8_ + lVar4 * 8))->x * (this->vInvScreenSize).x;
    fVar6 = ((pointer)(local_a8._8_8_ + lVar4 * 8))->y * (this->vInvScreenSize).y;
    ((pointer)(local_a8._8_8_ + lVar4 * 8))->x = fVar5 + fVar5 + -1.0;
    ((pointer)(local_a8._8_8_ + lVar4 * 8))->y = fVar6 + fVar6 + -1.0;
    ((pointer)(local_a8._8_8_ + lVar4 * 8))->y = -((pointer)(local_a8._8_8_ + lVar4 * 8))->y;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  fVar5 = (decal->vUVScale).x;
  fVar6 = (decal->vUVScale).y;
  local_c8 = (anon_union_4_2_12391da5_for_Pixel_0)(source_pos->x * fVar5);
  aStack_c4 = (anon_union_4_2_12391da5_for_Pixel_0)(source_pos->y * fVar6);
  local_b8 = fVar5 * source_size->x + (float)local_c8;
  aStack_bc = (anon_union_4_2_12391da5_for_Pixel_0)(fVar6 * source_size->y + (float)aStack_c4);
  aStack_c0 = local_c8;
  local_b4 = (float)aStack_bc;
  local_b0 = local_b8;
  local_ac = (float)aStack_c4;
  std::vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>>::
  _M_assign_aux<olc::v2d_generic<float>const*>
            ((vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>> *)&local_88,
             &local_c8);
  DStack_40 = this->nDecalMode;
  std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
            (&(this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
              _M_impl.super__Vector_impl_data._M_start[this->nTargetLayer].vecDecalInstance,
             (value_type *)local_a8);
  if (local_58 != (pointer)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  if (pfStack_70 != (pointer)0x0) {
    operator_delete(pfStack_70,(long)pfStack_60 - (long)pfStack_70);
  }
  if (local_88 != (pointer)0x0) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_a8._24_8_ - local_a8._8_8_);
  }
  return;
}

Assistant:

void PixelGameEngine::DrawPartialRotatedDecal(const olc::vf2d &pos, olc::Decal *decal, const float fAngle, const olc::vf2d &center, const olc::vf2d &source_pos, const olc::vf2d &source_size, const olc::vf2d &scale, const olc::Pixel &tint)
	{
		DecalInstance di;
		di.decal = decal;
		di.points = 4;
		di.tint = {tint, tint, tint, tint};
		di.w = {1, 1, 1, 1};
		di.pos.resize(4);
		di.pos[0] = (olc::vf2d(0.0f, 0.0f) - center) * scale;
		di.pos[1] = (olc::vf2d(0.0f, source_size.y) - center) * scale;
		di.pos[2] = (olc::vf2d(source_size.x, source_size.y) - center) * scale;
		di.pos[3] = (olc::vf2d(source_size.x, 0.0f) - center) * scale;
		float c = cos(fAngle), s = sin(fAngle);
		for (int i = 0; i < 4; i++)
		{
			di.pos[i] = pos + olc::vf2d(di.pos[i].x * c - di.pos[i].y * s, di.pos[i].x * s + di.pos[i].y * c);
			di.pos[i] = di.pos[i] * vInvScreenSize * 2.0f - olc::vf2d(1.0f, 1.0f);
			di.pos[i].y *= -1.0f;
		}

		olc::vf2d uvtl = source_pos * decal->vUVScale;
		olc::vf2d uvbr = uvtl + (source_size * decal->vUVScale);
		di.uv = {{uvtl.x, uvtl.y}, {uvtl.x, uvbr.y}, {uvbr.x, uvbr.y}, {uvbr.x, uvtl.y}};
		di.mode = nDecalMode;
		vLayers[nTargetLayer].vecDecalInstance.push_back(di);
	}